

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O3

bool __thiscall
miniminer_tests::sanity_check
          (miniminer_tests *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *transactions,
          map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          *bumpfees)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it;
  long lVar7;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it_00;
  long in_FS_OFFSET;
  COutPoint outpoint_;
  key_type local_98;
  undefined1 local_68 [8];
  _Rb_tree_node_base _Stack_60;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var5 = (bumpfees->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(bumpfees->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    uVar3 = (long)transactions - (long)this;
    do {
      if ((long)p_Var5[2]._M_parent < 0) goto LAB_00458750;
      if (p_Var5[2]._M_parent != (_Base_ptr)0x0) {
        _Stack_60._M_right = (_Base_ptr)CONCAT44(_Stack_60._M_right._4_4_,p_Var5[2]._M_color);
        local_68._0_4_ = p_Var5[1]._M_color;
        local_68._4_4_ = *(undefined4 *)&p_Var5[1].field_0x4;
        _Stack_60._0_8_ = p_Var5[1]._M_parent;
        _Stack_60._M_parent = p_Var5[1]._M_left;
        _Stack_60._M_left = p_Var5[1]._M_right;
        uVar4 = uVar3;
        __it._M_current = (shared_ptr<const_CTransaction> *)this;
        lVar7 = ((long)uVar3 >> 6) + 1;
        __it_00._M_current = (shared_ptr<const_CTransaction> *)this;
        if (0 < (long)uVar3 >> 6) {
          do {
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                  *)local_68,__it_00);
            __it._M_current = __it_00._M_current;
            if (bVar2) goto LAB_00458633;
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                  *)local_68,__it_00._M_current + 1);
            __it._M_current = __it_00._M_current + 1;
            if (bVar2) goto LAB_00458633;
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                  *)local_68,__it_00._M_current + 2);
            __it._M_current = __it_00._M_current + 2;
            if (bVar2) goto LAB_00458633;
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                    ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                  *)local_68,__it_00._M_current + 3);
            __it._M_current = __it_00._M_current + 3;
            if (bVar2) goto LAB_00458633;
            lVar7 = lVar7 + -1;
            uVar4 = (long)transactions - (long)(this + (uVar3 & 0xffffffffffffffc0));
            __it._M_current =
                 (shared_ptr<const_CTransaction> *)(this + (uVar3 & 0xffffffffffffffc0));
            __it_00._M_current = __it_00._M_current + 4;
          } while (1 < lVar7);
        }
        lVar7 = (long)uVar4 >> 4;
        if (lVar7 == 1) {
LAB_0045860d:
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                *)local_68,__it);
          if (!bVar2) {
            __it._M_current = (shared_ptr<const_CTransaction> *)transactions;
          }
        }
        else if (lVar7 == 2) {
LAB_004585f8:
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                *)local_68,__it);
          if (!bVar2) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0045860d;
          }
        }
        else {
          if (lVar7 != 3) goto LAB_00458750;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                                *)local_68,__it);
          if (!bVar2) {
            __it._M_current = __it._M_current + 1;
            goto LAB_004585f8;
          }
        }
LAB_00458633:
        if ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)__it._M_current == transactions) goto LAB_00458750;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  bVar2 = true;
  if (this != (miniminer_tests *)transactions) {
    do {
      lVar7 = *(long *)this;
      if (1 < (ulong)((*(long *)(lVar7 + 0x20) - *(long *)(lVar7 + 0x18) >> 3) * -0x3333333333333333
                     )) {
        _Stack_60._0_8_ = _Stack_60._0_8_ & 0xffffffff00000000;
        _Stack_60._M_parent = (_Base_ptr)0x0;
        _Stack_60._M_left = &_Stack_60;
        local_40 = 0;
        _Stack_60._M_right = _Stack_60._M_left;
        if (*(long *)(lVar7 + 0x20) == *(long *)(lVar7 + 0x18)) {
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                     *)local_68);
        }
        else {
          uVar3 = 0;
          do {
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)(lVar7 + 0x39);
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)(lVar7 + 0x41);
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)(lVar7 + 0x49);
            local_98.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)(lVar7 + 0x51);
            local_98.n = (uint32_t)uVar3;
            cVar6 = std::
                    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                    ::find(&bumpfees->_M_t,&local_98);
            if ((_Rb_tree_header *)cVar6._M_node != p_Var1) {
              std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
              _M_insert_unique<long_const&>
                        ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                          *)local_68,(long *)&cVar6._M_node[2]._M_parent);
            }
            uVar4 = local_40;
            lVar7 = *(long *)this;
            uVar3 = uVar3 + 1;
          } while (uVar3 < (ulong)((*(long *)(lVar7 + 0x20) - *(long *)(lVar7 + 0x18) >> 3) *
                                  -0x3333333333333333));
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                     *)local_68);
          if (1 < uVar4) goto LAB_00458750;
        }
      }
      this = this + 0x10;
    } while (this != (miniminer_tests *)transactions);
    bVar2 = true;
  }
LAB_00458752:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
LAB_00458750:
  bVar2 = false;
  goto LAB_00458752;
}

Assistant:

static inline bool sanity_check(const std::vector<CTransactionRef>& transactions,
                                const std::map<COutPoint, CAmount>& bumpfees)
{
    // No negative bumpfees.
    for (const auto& [outpoint, fee] : bumpfees) {
        if (fee < 0) return false;
        if (fee == 0) continue;
        auto outpoint_ = outpoint; // structured bindings can't be captured in C++17, so we need to use a variable
        const bool found = std::any_of(transactions.cbegin(), transactions.cend(), [&](const auto& tx) {
            return outpoint_.hash == tx->GetHash() && outpoint_.n < tx->vout.size();
        });
        if (!found) return false;
    }
    for (const auto& tx : transactions) {
        // If tx has multiple outputs, they must all have the same bumpfee (if they exist).
        if (tx->vout.size() > 1) {
            std::set<CAmount> distinct_bumpfees;
            for (size_t i{0}; i < tx->vout.size(); ++i) {
                const auto bumpfee = bumpfees.find(COutPoint{tx->GetHash(), static_cast<uint32_t>(i)});
                if (bumpfee != bumpfees.end()) distinct_bumpfees.insert(bumpfee->second);
            }
            if (distinct_bumpfees.size() > 1) return false;
        }
    }
    return true;
}